

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O0

int overlapping_memop(dmr_C *C,instruction *a,instruction *b)

{
  uint uVar1;
  uint uVar2;
  uint b_size;
  uint a_size;
  uint b_start;
  uint a_start;
  instruction *b_local;
  instruction *a_local;
  dmr_C *C_local;
  
  uVar1 = dmrC_bytes_to_bits(C->target,(a->field_6).field_5.offset);
  uVar2 = dmrC_bytes_to_bits(C->target,(b->field_6).field_5.offset);
  if (uVar2 < (*(uint *)a >> 8) + uVar1) {
    if (uVar1 < (*(uint *)b >> 8) + uVar2) {
      C_local._4_4_ = 1;
    }
    else {
      C_local._4_4_ = 0;
    }
  }
  else {
    C_local._4_4_ = 0;
  }
  return C_local._4_4_;
}

Assistant:

static int overlapping_memop(struct dmr_C *C, struct instruction *a, struct instruction *b)
{
	unsigned int a_start = dmrC_bytes_to_bits(C->target, a->offset);
	unsigned int b_start = dmrC_bytes_to_bits(C->target, b->offset);
	unsigned int a_size = a->size;
	unsigned int b_size = b->size;

	if (a_size + a_start <= b_start)
		return 0;
	if (b_size + b_start <= a_start)
		return 0;
	return 1;
}